

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_node_sequence_remove(fy_node *fyn_seq,fy_node *fyn)

{
  _Bool _Var1;
  fy_node *fyn_local;
  fy_node *fyn_seq_local;
  
  _Var1 = fy_node_sequence_contains_node(fyn_seq,fyn);
  if (_Var1) {
    fy_node_list_del(&(fyn_seq->field_12).sequence,fyn);
    fyn->parent = (fy_node *)0x0;
    fyn->field_0x34 = fyn->field_0x34 & 0xf7;
    fy_node_mark_synthetic(fyn_seq);
    fyn_seq_local = fyn;
  }
  else {
    fyn_seq_local = (fy_node *)0x0;
  }
  return fyn_seq_local;
}

Assistant:

struct fy_node *fy_node_sequence_remove(struct fy_node *fyn_seq, struct fy_node *fyn) {
    if (!fy_node_sequence_contains_node(fyn_seq, fyn))
        return NULL;

    fy_node_list_del(&fyn_seq->sequence, fyn);
    fyn->parent = NULL;
    fyn->attached = false;

    fy_node_mark_synthetic(fyn_seq);

    return fyn;
}